

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall
wasm::SubTypes::
iterSubTypes<wasm::(anonymous_namespace)::Flower::writeToData(wasm::Expression*,wasm::Expression*,unsigned_int)::__0>
          (SubTypes *this,HeapType type,Index depth,anon_class_24_3_7037b1ec func)

{
  uint depth_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  bool bVar1;
  Item *pIVar2;
  reference pHVar3;
  Item local_170;
  uintptr_t local_160;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_158;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *subVec;
  HeapType local_148;
  HeapType type_1;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *currVec;
  Index currDepth;
  Item *item;
  Item local_f8;
  undefined1 local_e8 [8];
  SmallVector<Item,_10UL> work;
  Index depth_local;
  SubTypes *this_local;
  HeapType type_local;
  
  work.flexible.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)type.id;
  anon_unknown_183::Flower::writeToData::anon_class_24_3_7037b1ec::operator()(&func,type,0);
  if (depth != 0) {
    SmallVector<Item,_10UL>::SmallVector((SmallVector<Item,_10UL> *)local_e8);
    local_f8.vec = getImmediateSubTypes(this,type);
    local_f8.depth = 1;
    SmallVector<Item,_10UL>::push_back((SmallVector<Item,_10UL> *)local_e8,&local_f8);
    while (bVar1 = SmallVector<Item,_10UL>::empty((SmallVector<Item,_10UL> *)local_e8),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pIVar2 = SmallVector<Item,_10UL>::back((SmallVector<Item,_10UL> *)local_e8);
      SmallVector<Item,_10UL>::pop_back((SmallVector<Item,_10UL> *)local_e8);
      depth_00 = pIVar2->depth;
      this_00 = pIVar2->vec;
      if (depth < depth_00) {
        __assert_fail("currDepth <= depth",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtypes.h"
                      ,0xb7,
                      "void wasm::SubTypes::iterSubTypes(HeapType, Index, F) const [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp:3019:47)]"
                     );
      }
      __end0 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
      type_1.id = (uintptr_t)
                  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                         *)&type_1), bVar1) {
        pHVar3 = __gnu_cxx::
                 __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                 ::operator*(&__end0);
        subVec = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pHVar3->id;
        local_148.id = (uintptr_t)subVec;
        anon_unknown_183::Flower::writeToData::anon_class_24_3_7037b1ec::operator()
                  (&func,(HeapType)subVec,depth_00);
        local_160 = local_148.id;
        local_158 = getImmediateSubTypes(this,local_148);
        if ((depth_00 + 1 <= depth) &&
           (bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(local_158),
           !bVar1)) {
          local_170.vec = local_158;
          local_170.depth = depth_00 + 1;
          SmallVector<Item,_10UL>::push_back((SmallVector<Item,_10UL> *)local_e8,&local_170);
        }
        __gnu_cxx::
        __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end0);
      }
    }
    SmallVector<Item,_10UL>::~SmallVector((SmallVector<Item,_10UL> *)local_e8);
  }
  return;
}

Assistant:

void iterSubTypes(HeapType type, Index depth, F func) const {
    // Start by traversing the type itself.
    func(type, 0);

    if (depth == 0) {
      // Nothing else to scan.
      return;
    }

    // getImmediateSubTypes() returns vectors of subtypes, so for efficiency
    // store pointers to those in our work queue to avoid allocations. See the
    // note below on typeSubTypes for why this is safe.
    struct Item {
      const std::vector<HeapType>* vec;
      Index depth;
    };

    // Real-world type hierarchies tend to have a limited depth, so try to avoid
    // allocations in our work queue with a SmallVector.
    SmallVector<Item, 10> work;

    // Start with the subtypes of the base type. Those have depth 1.
    work.push_back({&getImmediateSubTypes(type), 1});

    while (!work.empty()) {
      auto& item = work.back();
      work.pop_back();
      auto currDepth = item.depth;
      auto& currVec = *item.vec;
      assert(currDepth <= depth);
      for (auto type : currVec) {
        func(type, currDepth);
        auto* subVec = &getImmediateSubTypes(type);
        if (currDepth + 1 <= depth && !subVec->empty()) {
          work.push_back({subVec, currDepth + 1});
        }
      }
    }
  }